

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMarkAsAdvancedCommand.cxx
# Opt level: O3

bool cmMarkAsAdvancedCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  PolicyStatus PVar4;
  cmState *this;
  cmValue cVar5;
  cmake *this_00;
  pointer pbVar6;
  ulong uVar7;
  string *key;
  uint uVar8;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string err;
  char *__end;
  string local_a0;
  undefined8 local_80;
  char *local_78;
  char *local_70;
  cmMakefile *local_68;
  string local_60;
  cmExecutionStatus *local_40;
  char *local_38;
  
  pbVar6 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar6 == (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
LAB_002aa489:
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
LAB_002aa496:
    bVar1 = false;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)pbVar6);
    if ((iVar3 == 0) ||
       (iVar3 = std::__cxx11::string::compare
                          ((char *)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start), iVar3 == 0)) {
      iVar3 = std::__cxx11::string::compare
                        ((char *)(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
      local_70 = "1";
      if (iVar3 == 0) {
        local_70 = "0";
      }
      bVar2 = true;
      uVar8 = 1;
    }
    else {
      local_70 = "1";
      uVar8 = 0;
      bVar2 = false;
    }
    local_68 = status->Makefile;
    this = cmMakefile::GetState(local_68);
    uVar7 = (ulong)uVar8;
    pbVar6 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    bVar1 = true;
    if (uVar7 < (ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >> 5)) {
      local_38 = local_70 + 1;
      local_40 = status;
      do {
        uVar8 = uVar8 + 1;
        key = pbVar6 + uVar7;
        PVar4 = cmMakefile::GetPolicyStatus(local_68,CMP0102,false);
        if (PVar4 - NEW < 3) {
          cVar5 = cmState::GetCacheEntryValue(this,key);
          if (cVar5.Value != (string *)0x0) goto LAB_002aa327;
        }
        else {
          if (PVar4 != OLD) {
            if (PVar4 != WARN) goto LAB_002aa327;
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a0,"CMAKE_POLICY_WARNING_CMP0102","");
            bVar1 = cmMakefile::PolicyOptionalWarningEnabled(local_68,&local_a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
            }
            if ((bVar1) &&
               (cVar5 = cmState::GetCacheEntryValue(this,key), cVar5.Value == (string *)0x0)) {
              local_a0.field_2._8_8_ = (key->_M_dataplus)._M_p;
              local_a0.field_2._M_allocated_capacity = key->_M_string_length;
              local_a0._M_dataplus._M_p = (pointer)0x2f;
              local_a0._M_string_length = 0x7a3f1f;
              local_80 = 0xf9;
              local_78 = 
              "\" is not in the cache. This results in an empty cache entry which is no longer created when policy CMP0102 is set to NEW. Run \"cmake --help-policy CMP0102\" for policy details. Use the cmake_policy command to set the policy and suppress this warning."
              ;
              views._M_len = 3;
              views._M_array = (iterator)&local_a0;
              cmCatViews_abi_cxx11_(&local_60,views);
              cmMakefile::IssueMessage(local_68,AUTHOR_WARNING,&local_60);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_dataplus._M_p != &local_60.field_2) {
                operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1
                               );
              }
            }
          }
          cVar5 = cmState::GetCacheEntryValue(this,key);
          if (cVar5.Value == (string *)0x0) {
            this_00 = cmMakefile::GetCMakeInstance(local_40->Makefile);
            cmake::AddCacheEntry(this_00,key,(cmValue)0x0,(char *)0x0,6);
            bVar2 = true;
          }
LAB_002aa327:
          cVar5 = cmState::GetCacheEntryValue(this,key);
          if (cVar5.Value == (string *)0x0) {
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a0,"This should never happen...","");
            cmSystemTools::Error(&local_a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p == &local_a0.field_2) goto LAB_002aa496;
            goto LAB_002aa489;
          }
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"ADVANCED","");
          cVar5 = cmState::GetCacheEntryProperty(this,key,&local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          if (cVar5.Value == (string *)0x0 || bVar2) {
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"ADVANCED","");
            local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,local_70,local_38);
            cmState::SetCacheEntryProperty(this,key,&local_a0,&local_60);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            bVar2 = false;
          }
        }
        uVar7 = (ulong)uVar8;
        pbVar6 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      } while (uVar7 < (ulong)((long)(args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >> 5
                              ));
      bVar1 = true;
    }
  }
  return bVar1;
}

Assistant:

bool cmMarkAsAdvancedCommand(std::vector<std::string> const& args,
                             cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  unsigned int i = 0;
  const char* value = "1";
  bool overwrite = false;
  if (args[0] == "CLEAR" || args[0] == "FORCE") {
    overwrite = true;
    if (args[0] == "CLEAR") {
      value = "0";
    }
    i = 1;
  }

  cmMakefile& mf = status.GetMakefile();
  cmState* state = mf.GetState();

  for (; i < args.size(); ++i) {
    std::string const& variable = args[i];

    bool issueMessage = false;
    bool oldBehavior = false;
    bool ignoreVariable = false;
    switch (mf.GetPolicyStatus(cmPolicies::CMP0102)) {
      case cmPolicies::WARN:
        if (mf.PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0102")) {
          if (!state->GetCacheEntryValue(variable)) {
            issueMessage = true;
          }
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        oldBehavior = true;
        break;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        if (!state->GetCacheEntryValue(variable)) {
          ignoreVariable = true;
        }
        break;
    }

    // First see if we should issue a message about CMP0102
    if (issueMessage) {
      std::string err = cmStrCat(
        "Policy CMP0102 is not set: The variable named \"", variable,
        "\" is not in the cache. This results in an empty cache entry which "
        "is no longer created when policy CMP0102 is set to NEW. Run \"cmake "
        "--help-policy CMP0102\" for policy details. Use the cmake_policy "
        "command to set the policy and suppress this warning.");
      mf.IssueMessage(MessageType::AUTHOR_WARNING, err);
    }

    // If it's not in the cache and we're using the new behavior, nothing to
    // see here.
    if (ignoreVariable) {
      continue;
    }

    // Check if we want the old behavior of making a dummy cache entry.
    if (oldBehavior) {
      if (!state->GetCacheEntryValue(variable)) {
        status.GetMakefile().GetCMakeInstance()->AddCacheEntry(
          variable, nullptr, nullptr, cmStateEnums::UNINITIALIZED);
        overwrite = true;
      }
    }

    // We need a cache entry to do this.
    if (!state->GetCacheEntryValue(variable)) {
      cmSystemTools::Error("This should never happen...");
      return false;
    }
    if (!state->GetCacheEntryProperty(variable, "ADVANCED") || overwrite) {
      state->SetCacheEntryProperty(variable, "ADVANCED", value);
    }
  }
  return true;
}